

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-readable-nor-writable-on-read-error.c
# Opt level: O2

int run_test_not_readable_nor_writable_on_read_error(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in sa;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sa);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_loop_init(&loop);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_tcp_init(&loop,&tcp_client);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_tcp_connect(&connect_req,&tcp_client,&sa,connect_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_run(&loop,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            eval_a = 1;
            eval_b = (int64_t)connect_cb_called;
            if (eval_b == 1) {
              eval_a = 1;
              eval_b = (int64_t)read_cb_called;
              if (eval_b == 1) {
                eval_a = 1;
                eval_b = (int64_t)write_cb_called;
                if (eval_b == 1) {
                  eval_a = 1;
                  eval_b = (int64_t)close_cb_called;
                  if (eval_b == 1) {
                    uv_walk(&loop,close_walk_cb,0);
                    uv_run(&loop,0);
                    eval_a = 0;
                    iVar1 = uv_loop_close(&loop);
                    eval_b = (int64_t)iVar1;
                    if (eval_b == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar3 = "uv_loop_close(&loop)";
                    pcVar2 = "0";
                    uVar4 = 0x66;
                  }
                  else {
                    pcVar3 = "close_cb_called";
                    pcVar2 = "1";
                    uVar4 = 100;
                  }
                }
                else {
                  pcVar3 = "write_cb_called";
                  pcVar2 = "1";
                  uVar4 = 99;
                }
              }
              else {
                pcVar3 = "read_cb_called";
                pcVar2 = "1";
                uVar4 = 0x62;
              }
            }
            else {
              pcVar3 = "connect_cb_called";
              pcVar2 = "1";
              uVar4 = 0x61;
            }
          }
          else {
            pcVar3 = "0";
            pcVar2 = "uv_run(&loop, UV_RUN_DEFAULT)";
            uVar4 = 0x5f;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = 
          "uv_tcp_connect(&connect_req, &tcp_client, (const struct sockaddr*) &sa, connect_cb)";
          uVar4 = 0x5d;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "uv_tcp_init(&loop, &tcp_client)";
        uVar4 = 0x58;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "uv_loop_init(&loop)";
      uVar4 = 0x57;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "uv_ip4_addr(\"127.0.0.1\", 9123, &sa)";
    uVar4 = 0x56;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(not_readable_nor_writable_on_read_error) {
  struct sockaddr_in sa;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &sa));
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_tcp_init(&loop, &tcp_client));

  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_client,
                           (const struct sockaddr*) &sa,
                           connect_cb));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}